

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

C_Type * typeof_specifier(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  C_Type *pCVar2;
  C_Node *node;
  C_Token *pCVar3;
  C_Token *local_28;
  C_Token *local_20;
  
  local_28 = tok;
  local_28 = C_skip(parser,tok,"(");
  _Var1 = is_typename(parser,local_28);
  if (_Var1) {
    local_20 = local_28;
    pCVar2 = declspec(parser,&local_20,local_28,(VarAttr *)0x0);
    pCVar2 = abstract_declarator(parser,&local_28,local_20,pCVar2);
  }
  else {
    node = expr(parser,&local_28,local_28);
    C_add_type(parser,node);
    pCVar2 = node->ty;
  }
  pCVar3 = C_skip(parser,local_28,")");
  *rest = pCVar3;
  return pCVar2;
}

Assistant:

static C_Type *typeof_specifier(C_Parser *parser, C_Token **rest, C_Token *tok) {
  tok = C_skip(parser, tok, "(");

  C_Type *ty;
  if (is_typename(parser, tok)) {
    ty = typename(parser, &tok, tok);
  } else {
    C_Node *node = expr(parser, &tok, tok);
    C_add_type(parser, node);
    ty = node->ty;
  }
  *rest = C_skip(parser, tok, ")");
  return ty;
}